

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int main(int argc,char **argv)

{
  ptls_context_t *__dest;
  st_ptls_ffx_test_variants_t *psVar1;
  int iVar2;
  X509_STORE *pXVar3;
  BIO *pBVar4;
  EVP_PKEY *pEVar5;
  st_ptls_ffx_test_variants_t *psVar6;
  ptls_iovec_t key;
  ptls_key_exchange_context_t *esni_private_keys [2];
  ptls_iovec_t minicrypto_certificate;
  ptls_iovec_t cert;
  ptls_minicrypto_secp256r1sha256_sign_certificate_t minicrypto_sign_certificate;
  ptls_openssl_sign_certificate_t openssl_sign_certificate;
  ptls_context_t openssl_ctx_sha256only;
  ptls_key_exchange_context_t *local_348;
  undefined8 local_340;
  ptls_verify_certificate_t local_330;
  X509_STORE *local_328;
  ptls_context_t local_320;
  ptls_context_t local_258;
  ptls_iovec_t local_190;
  ptls_iovec_t local_180;
  ptls_minicrypto_secp256r1sha256_sign_certificate_t local_170;
  undefined1 local_148 [104];
  ptls_cipher_suite_t **local_e0;
  
  OPENSSL_init_crypto(2,0);
  OPENSSL_init_crypto(0xc,0);
  ENGINE_load_builtin_engines();
  ENGINE_register_all_ciphers();
  ENGINE_register_all_digests();
  if (argc < 2) {
    subtest("bf",test_bf);
    subtest("key-exchange",test_key_exchanges);
    setup_certificate(&local_180);
    pBVar4 = BIO_new_mem_buf("-----BEGIN RSA PRIVATE KEY-----\nMIIEowIBAAKCAQEA5soWzSG7iyawQlHM1yaX2dUAATUkhpbg2WPFOEem7E3zYzc6\nA/Z+bViFlfEgL37cbDUb4pnOAHrrsjGgkyBYh5i9iCTVfCk+H6SOHZJORO1Tq8X9\nC7WcNcshpSdm2Pa8hmv9hsHbLSeoPNeg8NkTPwMVaMZ2GpdmiyAmhzSZ2H9mzNI7\nntPW/XCchVf+ax2yt9haZ+mQE2NPYwHDjqCtdGkP5ZXXnYhJSBzSEhxfGckIiKDy\nOxiNkLFLvUdT4ERSFBjauP2cSI0XoOUsiBxJNwHH310AU8jZbveSTcXGYgEuu2MI\nuDo7Vhkq5+TCqXsIFNbjy0taOoPRvUbPsbqFlQIDAQABAoIBAQCWcUv1wjR/2+Nw\nB+Swp267R9bt8pdxyK6f5yKrskGErremiFygMrFtVBQYjws9CsRjISehSkN4GqjE\nCweygJZVJeL++YvUmQnvFJSzgCjXU6GEStbOKD/A7T5sa0fmzMhOE907V+kpAT3x\nE1rNRaP/ImJ1X1GjuefVb0rOPiK/dehFQWfsUkOvh+J3PU76wcnexxzJgxhVxdfX\nqNa7UDsWzTImUjcHIfnhXc1K/oSKk6HjImQi/oE4lgoJUCEDaUbq0nXNrM0EmTTv\nOQ5TVP5Lds9p8UDEa55eZllGXam0zKjhDKtkQ/5UfnxsAv2adY5cuH+XN0ExfKD8\nwIZ5qINtAoGBAPRbQGZZkP/HOYA4YZ9HYAUQwFS9IZrQ8Y7C/UbL01Xli13nKalH\nxXdG6Zv6Yv0FCJKA3N945lEof9rwriwhuZbyrA1TcKok/s7HR8Bhcsm2DzRD5OiC\n3HK+Xy+6fBaMebffqBPp3Lfj/lSPNt0w/8DdrKBTw/cAy40g0n1zEu07AoGBAPHJ\nV4IfQBiblCqDh77FfQRUNR4hVbbl00Gviigiw563nk7sxdrOJ1edTyTOUBHtM3zg\nAT9sYz2CUXvsyEPqzMDANWMb9e2R//NcP6aM4k7WQRnwkZkp0WOIH95U2o1MHCYc\n5meAHVf2UMl+64xU2ZfY3rjMmPLjWMt0hKYsOmtvAoGAClIQVkJSLXtsok2/Ucrh\n81TRysJyOOe6TB1QNT1Gn8oiKMUqrUuqu27zTvM0WxtrUUTAD3A7yhG71LN1p8eE\n3ytAuQ9dItKNMI6aKTX0czCNU9fKQ0fDp9UCkDGALDOisHFx1+V4vQuUIl4qIw1+\nv9adA+iFzljqP/uy6DmEAyECgYAyWCgecf9YoFxzlbuYH2rukdIVmf9M/AHG9ZQg\n00xEKhuOd4KjErXiamDmWwcVFHzaDZJ08E6hqhbpZN42Nhe4Ms1q+5FzjCjtNVIT\njdY5cCdSDWNjru9oeBmao7R2I1jhHrdi6awyeplLu1+0cp50HbYSaJeYS3pbssFE\nEIWBhQKBgG3xleD4Sg9rG2OWQz5IrvLFg/Hy7YWyushVez61kZeLDnt9iM2um76k\n/xFNIW0a+eL2VxRTCbXr9z86hjc/6CeSJHKYFQl4zsSAZkaIJ0+HbrhDNBAYh9b2\nmRdX+OMdZ7Z5J3Glt8ENFRqe8RlESMpAKxjR+dID0bjwAjVr2KCh\n-----END RSA PRIVATE KEY-----\n"
                             ,0x68b);
    pEVar5 = PEM_read_bio_PrivateKey(pBVar4,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
    if (pEVar5 == (EVP_PKEY *)0x0) {
      __assert_fail("pkey != NULL || !\"failed to load private key\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/openssl.c"
                    ,0xf2,"void setup_sign_certificate(ptls_openssl_sign_certificate_t *)");
    }
    BIO_free(pBVar4);
    ptls_openssl_init_sign_certificate
              ((ptls_openssl_sign_certificate_t *)local_148,(EVP_PKEY *)pEVar5);
    EVP_PKEY_free(pEVar5);
    pXVar3 = X509_STORE_new();
    X509_STORE_set_verify_cb(pXVar3,verify_cert_cb);
    local_330.cb = verify_cert;
    if (pXVar3 == (X509_STORE *)0x0) {
      pXVar3 = (X509_STORE *)ptls_openssl_create_default_certificate_store();
    }
    else {
      X509_STORE_up_ref(pXVar3);
    }
    local_320.random_bytes = ptls_openssl_random_bytes;
    local_320.get_time = &ptls_get_time;
    local_320.key_exchanges = ptls_openssl_key_exchanges;
    local_320.cipher_suites = ptls_openssl_cipher_suites;
    local_320.certificates.count = 1;
    local_320.esni = (ptls_esni_context_t **)0x0;
    local_320.on_client_hello = (ptls_on_client_hello_t *)0x0;
    local_320.emit_certificate = (ptls_emit_certificate_t *)0x0;
    local_320.verify_certificate = (ptls_verify_certificate_t *)0x0;
    local_320.ticket_lifetime._0_1_ = 0;
    local_320._89_7_ = 0;
    local_320.hkdf_label_prefix__obsolete._0_1_ = 0;
    local_320._97_8_ = 0;
    local_320.encrypt_ticket = (ptls_encrypt_ticket_t *)0x0;
    local_320.save_ticket = (ptls_save_ticket_t *)0x0;
    local_320.log_event = (ptls_log_event_t *)0x0;
    local_320.update_open_count = (ptls_update_open_count_t *)0x0;
    local_320.update_traffic_key = (ptls_update_traffic_key_t *)0x0;
    local_320.decompress_certificate = (ptls_decompress_certificate_t *)0x0;
    local_320.update_esni_key = (ptls_update_esni_key_t *)0x0;
    local_320.pkey_buf.base = (uint8_t *)0x0;
    local_320.pkey_buf.len = 0;
    local_320.on_extension = (ptls_on_extension_t *)0x0;
    local_320.private_key_method = (ptls_private_key_method_t *)0x0;
    local_328 = pXVar3;
    local_320.certificates.list = &local_180;
    local_320.sign_certificate = (ptls_sign_certificate_t *)local_148;
    if (ptls_openssl_cipher_suites[0]->hash->digest_size != 0x30) {
      __assert_fail("openssl_ctx.cipher_suites[0]->hash->digest_size == 48",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/openssl.c"
                    ,0x171,"int main(int, char **)");
    }
    __dest = (ptls_context_t *)(local_148 + 0x50);
    memcpy(__dest,&local_320,200);
    if (local_e0[1]->hash->digest_size != 0x20) {
      local_e0 = local_e0 + 1;
      __assert_fail("openssl_ctx_sha256only.cipher_suites[0]->hash->digest_size == 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/openssl.c"
                    ,0x174,"int main(int, char **)");
    }
    local_e0 = local_e0 + 1;
    pBVar4 = BIO_new_mem_buf("-----BEGIN EC PARAMETERS-----\nBggqhkjOPQMBBw==\n-----END EC PARAMETERS-----\n-----BEGIN EC PRIVATE KEY-----\nMHcCAQEEIGrRVTfTXuOVewLt/g+Ugvg9XW/g4lGXrkZ8fdYaYuJCoAoGCCqGSM49\nAwEHoUQDQgAEPu73EON1B6j7PvxiUCSVoGFu/2tjD6P9zDM20LEtVbqwBr20KYLG\n2e5mhKljlES+BOfuz6vCyd1A5siJiO2Uhg==\n-----END EC PRIVATE KEY-----\n"
                             ,0x12e);
    pEVar5 = PEM_read_bio_PrivateKey(pBVar4,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
    if (pEVar5 == (EVP_PKEY *)0x0) {
      __assert_fail("pkey != NULL && \"failed to load private key\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/openssl.c"
                    ,0xba,"ptls_key_exchange_context_t *key_from_pem(const char *)");
    }
    BIO_free(pBVar4);
    iVar2 = ptls_openssl_create_key_exchange
                      ((ptls_key_exchange_context_t **)&local_258,(EVP_PKEY *)pEVar5);
    if (iVar2 != 0) {
      __assert_fail("ret == 0 && \"failed to setup private key\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/openssl.c"
                    ,0xbf,"ptls_key_exchange_context_t *key_from_pem(const char *)");
    }
    EVP_PKEY_free(pEVar5);
    local_348 = (ptls_key_exchange_context_t *)local_258.random_bytes;
    local_340 = 0;
    verify_certificate = &local_330;
    psVar1 = ffx_variants;
    do {
      psVar6 = psVar1;
      psVar1 = psVar6 + 1;
    } while (psVar6->algo != (ptls_cipher_algorithm_t *)0x0);
    ctx_peer = &local_320;
    ctx = &local_320;
    psVar6->algo = &ptls_ffx_ptls_openssl_aes128ctr_b125_r8;
    psVar6->bit_length = 0x7d;
    psVar1 = ffx_variants;
    do {
      psVar6 = psVar1;
      psVar1 = psVar6 + 1;
    } while (psVar6->algo != (ptls_cipher_algorithm_t *)0x0);
    psVar6->algo = &ptls_ffx_ptls_openssl_aes128ctr_b31_r6;
    psVar6->bit_length = 0x1f;
    psVar1 = ffx_variants;
    do {
      psVar6 = psVar1;
      psVar1 = psVar6 + 1;
    } while (psVar6->algo != (ptls_cipher_algorithm_t *)0x0);
    psVar6->algo = &ptls_ffx_ptls_openssl_aes128ctr_b53_r4;
    psVar6->bit_length = 0x35;
    psVar1 = ffx_variants;
    do {
      psVar6 = psVar1;
      psVar1 = psVar6 + 1;
    } while (psVar6->algo != (ptls_cipher_algorithm_t *)0x0);
    psVar6->algo = &ptls_ffx_ptls_openssl_chacha20_b256_r8;
    psVar6->bit_length = 0x100;
    psVar1 = ffx_variants;
    do {
      psVar6 = psVar1;
      psVar1 = psVar6 + 1;
    } while (psVar6->algo != (ptls_cipher_algorithm_t *)0x0);
    psVar6->algo = &ptls_ffx_ptls_openssl_chacha20_b32_r6;
    psVar6->bit_length = 0x20;
    psVar1 = ffx_variants;
    do {
      psVar6 = psVar1;
      psVar1 = psVar6 + 1;
    } while (psVar6->algo != (ptls_cipher_algorithm_t *)0x0);
    psVar6->algo = &ptls_ffx_ptls_openssl_chacha20_b57_r4;
    psVar6->bit_length = 0x39;
    subtest("rsa-sign",test_rsa_sign);
    subtest("ecdsa-sign",test_ecdsa_sign);
    subtest("cert-verify",test_cert_verify);
    subtest("picotls",test_picotls);
    test_picotls_esni(&local_348);
    ctx_peer = __dest;
    ctx = __dest;
    subtest("picotls",test_picotls);
    ctx_peer = &local_320;
    ctx = __dest;
    subtest("picotls",test_picotls);
    ctx_peer = __dest;
    ctx = &local_320;
    subtest("picotls",test_picotls);
    local_190.base = (uint8_t *)anon_var_dwarf_27e6c;
    local_190.len = 0x264;
    key.len = 0x20;
    key.base = (uint8_t *)anon_var_dwarf_27e84;
    ptls_minicrypto_init_secp256r1sha256_sign_certificate(&local_170,key);
    local_258.random_bytes = ptls_minicrypto_random_bytes;
    local_258.get_time = &ptls_get_time;
    local_258.key_exchanges = ptls_minicrypto_key_exchanges;
    local_258.cipher_suites = ptls_minicrypto_cipher_suites;
    local_258.certificates.count = 1;
    local_258.esni = (ptls_esni_context_t **)0x0;
    local_258.on_client_hello = (ptls_on_client_hello_t *)0x0;
    local_258.emit_certificate = (ptls_emit_certificate_t *)0x0;
    local_258.verify_certificate = (ptls_verify_certificate_t *)0x0;
    local_258.ticket_lifetime._0_1_ = 0;
    local_258._89_7_ = 0;
    local_258.hkdf_label_prefix__obsolete._0_1_ = 0;
    local_258._97_8_ = 0;
    local_258.encrypt_ticket = (ptls_encrypt_ticket_t *)0x0;
    local_258.save_ticket = (ptls_save_ticket_t *)0x0;
    local_258.log_event = (ptls_log_event_t *)0x0;
    local_258.update_open_count = (ptls_update_open_count_t *)0x0;
    local_258.update_traffic_key = (ptls_update_traffic_key_t *)0x0;
    local_258.decompress_certificate = (ptls_decompress_certificate_t *)0x0;
    local_258.update_esni_key = (ptls_update_esni_key_t *)0x0;
    local_258.pkey_buf.base = (uint8_t *)0x0;
    local_258.pkey_buf.len = 0;
    local_258.on_extension = (ptls_on_extension_t *)0x0;
    local_258.private_key_method = (ptls_private_key_method_t *)0x0;
    ctx_peer = &local_258;
    ctx = &local_320;
    local_258.certificates.list = &local_190;
    local_258.sign_certificate = &local_170.super;
    subtest("vs. minicrypto",test_picotls);
    ctx_peer = &local_320;
    ctx = &local_258;
    subtest("minicrypto vs.",test_picotls);
    (*local_348->on_exchange)(&local_348,1,(ptls_iovec_t *)0x0,(ptls_iovec_t)ZEXT816(0));
LAB_00126e37:
    iVar2 = done_testing();
  }
  else {
    while (iVar2 = getopt(argc,argv,"s"), iVar2 != -1) {
      if (iVar2 == 0x73) {
        puts("Sign certificate");
        do_msg = 1;
        setup_certificate((ptls_iovec_t *)local_148);
        pXVar3 = X509_STORE_new();
        X509_STORE_set_verify_cb(pXVar3,verify_cert_cb);
        local_258.random_bytes = verify_cert;
        if (pXVar3 == (X509_STORE *)0x0) {
          pXVar3 = (X509_STORE *)ptls_openssl_create_default_certificate_store();
        }
        else {
          X509_STORE_up_ref(pXVar3);
        }
        local_320.random_bytes = ptls_openssl_random_bytes;
        local_320.get_time = &ptls_get_time;
        local_320.key_exchanges = ptls_openssl_key_exchanges;
        local_320.cipher_suites = ptls_openssl_cipher_suites;
        local_320.certificates.count = 1;
        local_320.esni = (ptls_esni_context_t **)0x0;
        local_320.on_client_hello = (ptls_on_client_hello_t *)0x0;
        local_320.emit_certificate = (ptls_emit_certificate_t *)0x0;
        local_320.sign_certificate = (ptls_sign_certificate_t *)(local_148 + 0x50);
        local_320.verify_certificate = (ptls_verify_certificate_t *)0x0;
        local_320.ticket_lifetime._0_1_ = 0;
        local_320._89_7_ = 0;
        local_320.hkdf_label_prefix__obsolete._0_1_ = 0;
        local_320._97_8_ = 0;
        local_320.encrypt_ticket = (ptls_encrypt_ticket_t *)0x0;
        local_320.save_ticket = (ptls_save_ticket_t *)0x0;
        local_320.log_event = (ptls_log_event_t *)0x0;
        local_320.update_open_count = (ptls_update_open_count_t *)0x0;
        local_320.update_traffic_key = (ptls_update_traffic_key_t *)0x0;
        local_320.decompress_certificate = (ptls_decompress_certificate_t *)0x0;
        local_320.update_esni_key = (ptls_update_esni_key_t *)0x0;
        local_320.pkey_buf.base = (uint8_t *)0x0;
        local_320.pkey_buf.len = 0;
        local_320.on_extension = (ptls_on_extension_t *)0x0;
        local_320.private_key_method = (ptls_private_key_method_t *)0x0;
        local_320.certificates.list = (ptls_iovec_t *)local_148;
        local_258.get_time = (ptls_get_time_t *)pXVar3;
        pBVar4 = BIO_new_mem_buf("-----BEGIN RSA PRIVATE KEY-----\nMIIEowIBAAKCAQEA5soWzSG7iyawQlHM1yaX2dUAATUkhpbg2WPFOEem7E3zYzc6\nA/Z+bViFlfEgL37cbDUb4pnOAHrrsjGgkyBYh5i9iCTVfCk+H6SOHZJORO1Tq8X9\nC7WcNcshpSdm2Pa8hmv9hsHbLSeoPNeg8NkTPwMVaMZ2GpdmiyAmhzSZ2H9mzNI7\nntPW/XCchVf+ax2yt9haZ+mQE2NPYwHDjqCtdGkP5ZXXnYhJSBzSEhxfGckIiKDy\nOxiNkLFLvUdT4ERSFBjauP2cSI0XoOUsiBxJNwHH310AU8jZbveSTcXGYgEuu2MI\nuDo7Vhkq5+TCqXsIFNbjy0taOoPRvUbPsbqFlQIDAQABAoIBAQCWcUv1wjR/2+Nw\nB+Swp267R9bt8pdxyK6f5yKrskGErremiFygMrFtVBQYjws9CsRjISehSkN4GqjE\nCweygJZVJeL++YvUmQnvFJSzgCjXU6GEStbOKD/A7T5sa0fmzMhOE907V+kpAT3x\nE1rNRaP/ImJ1X1GjuefVb0rOPiK/dehFQWfsUkOvh+J3PU76wcnexxzJgxhVxdfX\nqNa7UDsWzTImUjcHIfnhXc1K/oSKk6HjImQi/oE4lgoJUCEDaUbq0nXNrM0EmTTv\nOQ5TVP5Lds9p8UDEa55eZllGXam0zKjhDKtkQ/5UfnxsAv2adY5cuH+XN0ExfKD8\nwIZ5qINtAoGBAPRbQGZZkP/HOYA4YZ9HYAUQwFS9IZrQ8Y7C/UbL01Xli13nKalH\nxXdG6Zv6Yv0FCJKA3N945lEof9rwriwhuZbyrA1TcKok/s7HR8Bhcsm2DzRD5OiC\n3HK+Xy+6fBaMebffqBPp3Lfj/lSPNt0w/8DdrKBTw/cAy40g0n1zEu07AoGBAPHJ\nV4IfQBiblCqDh77FfQRUNR4hVbbl00Gviigiw563nk7sxdrOJ1edTyTOUBHtM3zg\nAT9sYz2CUXvsyEPqzMDANWMb9e2R//NcP6aM4k7WQRnwkZkp0WOIH95U2o1MHCYc\n5meAHVf2UMl+64xU2ZfY3rjMmPLjWMt0hKYsOmtvAoGAClIQVkJSLXtsok2/Ucrh\n81TRysJyOOe6TB1QNT1Gn8oiKMUqrUuqu27zTvM0WxtrUUTAD3A7yhG71LN1p8eE\n3ytAuQ9dItKNMI6aKTX0czCNU9fKQ0fDp9UCkDGALDOisHFx1+V4vQuUIl4qIw1+\nv9adA+iFzljqP/uy6DmEAyECgYAyWCgecf9YoFxzlbuYH2rukdIVmf9M/AHG9ZQg\n00xEKhuOd4KjErXiamDmWwcVFHzaDZJ08E6hqhbpZN42Nhe4Ms1q+5FzjCjtNVIT\njdY5cCdSDWNjru9oeBmao7R2I1jhHrdi6awyeplLu1+0cp50HbYSaJeYS3pbssFE\nEIWBhQKBgG3xleD4Sg9rG2OWQz5IrvLFg/Hy7YWyushVez61kZeLDnt9iM2um76k\n/xFNIW0a+eL2VxRTCbXr9z86hjc/6CeSJHKYFQl4zsSAZkaIJ0+HbrhDNBAYh9b2\nmRdX+OMdZ7Z5J3Glt8ENFRqe8RlESMpAKxjR+dID0bjwAjVr2KCh\n-----END RSA PRIVATE KEY-----\n"
                                 ,0x68b);
        pEVar5 = PEM_read_bio_PrivateKey(pBVar4,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
        if (pEVar5 == (EVP_PKEY *)0x0) {
          __assert_fail("pkey != NULL || !\"failed to load private key\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/openssl.c"
                        ,0x120,"int sign_only()");
        }
        BIO_free(pBVar4);
        msg("Enter sign");
        ptls_openssl_init_sign_certificate
                  ((ptls_openssl_sign_certificate_t *)(local_148 + 0x50),(EVP_PKEY *)pEVar5);
        msg("Did init");
        if (ptls_openssl_cipher_suites[1]->hash->digest_size != 0x20) {
          __assert_fail("openssl_ctx_sha256only.cipher_suites[0]->hash->digest_size == 32",
                        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/openssl.c"
                        ,0x127,"int sign_only()");
        }
        ctx_peer = &local_320;
        verify_certificate = (ptls_verify_certificate_t *)&local_258;
        psVar1 = ffx_variants;
        do {
          psVar6 = psVar1;
          psVar1 = psVar6 + 1;
        } while (psVar6->algo != (ptls_cipher_algorithm_t *)0x0);
        ctx = ctx_peer;
        psVar6->algo = &ptls_ffx_ptls_openssl_aes128ctr_b125_r8;
        psVar6->bit_length = 0x7d;
        psVar1 = ffx_variants;
        do {
          psVar6 = psVar1;
          psVar1 = psVar6 + 1;
        } while (psVar6->algo != (ptls_cipher_algorithm_t *)0x0);
        psVar6->algo = &ptls_ffx_ptls_openssl_aes128ctr_b31_r6;
        psVar6->bit_length = 0x1f;
        psVar1 = ffx_variants;
        do {
          psVar6 = psVar1;
          psVar1 = psVar6 + 1;
        } while (psVar6->algo != (ptls_cipher_algorithm_t *)0x0);
        psVar6->algo = &ptls_ffx_ptls_openssl_aes128ctr_b53_r4;
        psVar6->bit_length = 0x35;
        psVar1 = ffx_variants;
        do {
          psVar6 = psVar1;
          psVar1 = psVar6 + 1;
        } while (psVar6->algo != (ptls_cipher_algorithm_t *)0x0);
        psVar6->algo = &ptls_ffx_ptls_openssl_chacha20_b256_r8;
        psVar6->bit_length = 0x100;
        psVar1 = ffx_variants;
        do {
          psVar6 = psVar1;
          psVar1 = psVar6 + 1;
        } while (psVar6->algo != (ptls_cipher_algorithm_t *)0x0);
        psVar6->algo = &ptls_ffx_ptls_openssl_chacha20_b32_r6;
        psVar6->bit_length = 0x20;
        psVar1 = ffx_variants;
        do {
          psVar6 = psVar1;
          psVar1 = psVar6 + 1;
        } while (psVar6->algo != (ptls_cipher_algorithm_t *)0x0);
        psVar6->algo = &ptls_ffx_ptls_openssl_chacha20_b57_r4;
        psVar6->bit_length = 0x39;
        msg("Call test_full_handshake");
        test_just_one_handshake();
        msg("Done test_full_handshake");
        EVP_PKEY_free(pEVar5);
        goto LAB_00126e37;
      }
      puts("Usage: test-openssl.t [-s]");
      puts("   no parameters runs ALL tests");
      puts("   -s is a sign test where we test a single handshake with logging");
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char **argv)
{
    ptls_openssl_sign_certificate_t openssl_sign_certificate;
    ptls_openssl_verify_certificate_t openssl_verify_certificate;

    ERR_load_crypto_strings();
    OpenSSL_add_all_algorithms();
#if !defined(OPENSSL_NO_ENGINE)
    /* Load all compiled-in ENGINEs */
    ENGINE_load_builtin_engines();
    ENGINE_register_all_ciphers();
    ENGINE_register_all_digests();
#endif

#ifdef OPTS
    if (argc > 1)
    {
        int opt;
        while ((opt = getopt(argc, argv, "s")) != -1)
        {
            switch (opt)
            {
                case 's':
                    printf("Sign certificate\n");
                    return sign_only();
                default:
                    printf("Usage: test-openssl.t [-s]\n");
                    printf("   no parameters runs ALL tests\n");
                    printf("   -s is a sign test where we test a single handshake with logging\n");
                    break;
            }
        }
        return 1;
    }
#endif

    subtest("bf", test_bf);

    subtest("key-exchange", test_key_exchanges);

    ptls_iovec_t cert;
    setup_certificate(&cert);
    setup_sign_certificate(&openssl_sign_certificate);
    X509_STORE *cert_store = X509_STORE_new();
    X509_STORE_set_verify_cb(cert_store, verify_cert_cb);
    ptls_openssl_init_verify_certificate(&openssl_verify_certificate, cert_store);
    /* we should call X509_STORE_free on OpenSSL 1.1 or in prior versions decrement refount then call _free */
    ptls_context_t openssl_ctx = {ptls_openssl_random_bytes,
                                  &ptls_get_time,
                                  ptls_openssl_key_exchanges,
                                  ptls_openssl_cipher_suites,
                                  {&cert, 1},
                                  NULL,
                                  NULL,
                                  NULL,
                                  &openssl_sign_certificate.super};
    assert(openssl_ctx.cipher_suites[0]->hash->digest_size == 48); /* sha384 */
    ptls_context_t openssl_ctx_sha256only = openssl_ctx;
    ++openssl_ctx_sha256only.cipher_suites;
    assert(openssl_ctx_sha256only.cipher_suites[0]->hash->digest_size == 32); /* sha256 */

    ptls_key_exchange_context_t *esni_private_keys[2] = {key_from_pem(ESNI_SECP256R1KEY), NULL};

    ctx = ctx_peer = &openssl_ctx;
    verify_certificate = &openssl_verify_certificate.super;
    ADD_FFX_AES128_ALGORITHMS(openssl);
#if PTLS_OPENSSL_HAVE_CHACHA20_POLY1305
    ADD_FFX_CHACHA20_ALGORITHMS(openssl);
#endif

    subtest("rsa-sign", test_rsa_sign);
    subtest("ecdsa-sign", test_ecdsa_sign);
    subtest("cert-verify", test_cert_verify);
    subtest("picotls", test_picotls);
    test_picotls_esni(esni_private_keys);

    ctx = ctx_peer = &openssl_ctx_sha256only;
    subtest("picotls", test_picotls);

    ctx = &openssl_ctx_sha256only;
    ctx_peer = &openssl_ctx;
    subtest("picotls", test_picotls);

    ctx = &openssl_ctx;
    ctx_peer = &openssl_ctx_sha256only;
    subtest("picotls", test_picotls);

    ptls_minicrypto_secp256r1sha256_sign_certificate_t minicrypto_sign_certificate;
    ptls_iovec_t minicrypto_certificate = ptls_iovec_init(SECP256R1_CERTIFICATE, sizeof(SECP256R1_CERTIFICATE) - 1);
    ptls_minicrypto_init_secp256r1sha256_sign_certificate(
        &minicrypto_sign_certificate, ptls_iovec_init(SECP256R1_PRIVATE_KEY, sizeof(SECP256R1_PRIVATE_KEY) - 1));
    ptls_context_t minicrypto_ctx = {ptls_minicrypto_random_bytes,
                                     &ptls_get_time,
                                     ptls_minicrypto_key_exchanges,
                                     ptls_minicrypto_cipher_suites,
                                     {&minicrypto_certificate, 1},
                                     NULL,
                                     NULL,
                                     NULL,
                                     &minicrypto_sign_certificate.super};
    ctx = &openssl_ctx;
    ctx_peer = &minicrypto_ctx;
    subtest("vs. minicrypto", test_picotls);

    ctx = &minicrypto_ctx;
    ctx_peer = &openssl_ctx;
    subtest("minicrypto vs.", test_picotls);

    esni_private_keys[0]->on_exchange(esni_private_keys, 1, NULL, ptls_iovec_init(NULL, 0));
    return done_testing();
}